

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapchainImage.cpp
# Opt level: O2

vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
* myvk::SwapchainImage::Create
            (vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *__return_storage_ptr__,Ptr<Swapchain> *swapchain)

{
  element_type *peVar1;
  VkExtent2D VVar2;
  PFN_vkGetSwapchainImagesKHR p_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  uint32_t image_count;
  shared_ptr<myvk::SwapchainImage> ptr;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  uint local_5c;
  __shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_48;
  
  p_Var3 = vkGetSwapchainImagesKHR;
  iVar4 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268),
            ((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_swapchain,&local_5c,(VkImage *)0x0);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)&local_48,(ulong)local_5c,
             (allocator_type *)&local_58);
  p_Var3 = vkGetSwapchainImagesKHR;
  iVar4 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x268),
            ((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_swapchain,&local_5c,local_48._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::vector(__return_storage_ptr__,(ulong)local_5c,(allocator_type *)&local_58);
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < local_5c; uVar5 = uVar5 + 1) {
    std::make_shared<myvk::SwapchainImage>();
    std::__shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_58._M_ptr)->m_swapchain_ptr).
                super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>,
               &swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>);
    ((local_58._M_ptr)->super_ImageBase).m_image =
         local_48._M_impl.super__Vector_impl_data._M_start[uVar5];
    peVar1 = (swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ((local_58._M_ptr)->super_ImageBase).m_usage = (peVar1->m_swapchain_create_info).imageUsage;
    VVar2 = (peVar1->m_swapchain_create_info).imageExtent;
    ((local_58._M_ptr)->super_ImageBase).m_extent.width = VVar2.width;
    ((local_58._M_ptr)->super_ImageBase).m_extent.height = VVar2.height;
    *(undefined8 *)&((local_58._M_ptr)->super_ImageBase).m_extent.depth = 0x100000000;
    ((local_58._M_ptr)->super_ImageBase).m_format = (peVar1->m_swapchain_create_info).imageFormat;
    ((local_58._M_ptr)->super_ImageBase).m_mip_levels = 1;
    ((local_58._M_ptr)->super_ImageBase).m_array_layers = 1;
    std::__shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((__return_storage_ptr__->
                         super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               + lVar6),&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    lVar6 = lVar6 + 0x10;
  }
  std::_Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<SwapchainImage>> SwapchainImage::Create(const Ptr<Swapchain> &swapchain) {
	uint32_t image_count;
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count, nullptr);
	std::vector<VkImage> images(image_count);
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count,
	                        images.data());

	std::vector<Ptr<SwapchainImage>> ret(image_count);
	for (uint32_t i = 0; i < image_count; ++i) {
		auto ptr = std::make_shared<SwapchainImage>();
		ptr->m_swapchain_ptr = swapchain;
		ptr->m_image = images[i];

		ptr->m_usage = swapchain->GetImageUsage();
		ptr->m_extent = {swapchain->GetExtent().width, swapchain->GetExtent().height};
		ptr->m_type = VK_IMAGE_TYPE_2D;
		ptr->m_format = swapchain->GetImageFormat();
		ptr->m_mip_levels = 1;
		ptr->m_array_layers = 1;
		ret[i] = ptr;
	}
	return ret;
}